

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O2

void __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeLiteGenerator>::
cmExternalMakefileProjectGeneratorSimpleFactory
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeLiteGenerator> *this,string *n
          ,string *doc)

{
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)n);
  std::__cxx11::string::string((string *)&local_50,(string *)doc);
  cmExternalMakefileProjectGeneratorFactory::cmExternalMakefileProjectGeneratorFactory
            (&this->super_cmExternalMakefileProjectGeneratorFactory,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_cmExternalMakefileProjectGeneratorFactory).
  _vptr_cmExternalMakefileProjectGeneratorFactory =
       (_func_int **)&PTR__cmExternalMakefileProjectGeneratorFactory_00561f78;
  return;
}

Assistant:

cmExternalMakefileProjectGeneratorSimpleFactory(const std::string& n,
                                                  const std::string& doc)
    : cmExternalMakefileProjectGeneratorFactory(n, doc)
  {
  }